

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReaderManager.cpp
# Opt level: O0

int __thiscall BufferedReaderManager::init(BufferedReaderManager *this,EVP_PKEY_CTX *ctx)

{
  uint in_ECX;
  uint32_t in_EDX;
  uint local_34;
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t prereadThreshold_local;
  uint32_t allocSize_local;
  uint32_t blockSize_local;
  BufferedReaderManager *this_local;
  
  local_2c = (uint32_t)ctx;
  if (local_2c == 0) {
    local_2c = 0x200000;
  }
  this->m_blockSize = local_2c;
  local_30 = in_EDX;
  if (in_EDX == 0) {
    local_30 = this->m_blockSize + 0x8000;
  }
  this->m_allocSize = local_30;
  local_34 = in_ECX;
  if (in_ECX == 0) {
    local_34 = this->m_blockSize >> 1;
  }
  this->m_prereadThreshold = local_34;
  return (int)this;
}

Assistant:

void BufferedReaderManager::init(const uint32_t blockSize, const uint32_t allocSize, const uint32_t prereadThreshold)
{
    m_blockSize = blockSize > 0 ? blockSize : DEFAULT_FILE_BLOCK_SIZE;
    m_allocSize = allocSize > 0 ? allocSize : m_blockSize + MAX_AV_PACKET_SIZE;
    m_prereadThreshold = prereadThreshold > 0 ? prereadThreshold : m_blockSize / 2;
}